

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O2

bool __thiscall SightCheck::PTR_SightTraverse(SightCheck *this,intercept_t *in)

{
  F3DFloor **ppFVar1;
  double dVar2;
  uint uVar3;
  line_t_conflict *linedef;
  extsector_t *peVar4;
  F3DFloor *pFVar5;
  secplane_t *psVar6;
  secplane_t *psVar7;
  long *plVar8;
  double *pdVar9;
  double *pdVar10;
  undefined1 auVar11 [16];
  double x;
  bool bVar12;
  int iVar13;
  sector_t_conflict **ppsVar14;
  sector_t_conflict **ppsVar15;
  sector_t_conflict *psVar16;
  long lVar17;
  int i;
  int iVar18;
  F3DFloor **ppFVar19;
  FLinePortal *pFVar20;
  sector_t_conflict **ppsVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dStack_80;
  SightTask local_78;
  double local_58;
  double dStack_50;
  SightOpening local_48;
  
  linedef = (in->d).line;
  if (((i_compatflags._1_1_ & 0x20) == 0) || (linedef->frontsector != linedef->backsector)) {
    dVar2 = in->frac;
    x = dVar2 * (this->Trace).dx + (this->Trace).x;
    local_58 = dVar2 * (this->Trace).dy + (this->Trace).y;
    auVar11._8_4_ = SUB84(local_58,0);
    auVar11._0_8_ = x;
    auVar11._12_4_ = (int)((ulong)local_58 >> 0x20);
    dStack_50 = local_58;
    P_SightOpening(this,&local_48,linedef,x,local_58);
    pFVar20 = (FLinePortal *)0x0;
    if (linedef->portalindex < linePortals.Count) {
      pFVar20 = linePortals.Array + linedef->portalindex;
    }
    if ((local_48.range != 0 || local_48.portalflags != 0) ||
       ((pFVar20 != (FLinePortal *)0x0 && (pFVar20->mType == '\x03')))) {
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        return true;
      }
      if ((-3.4028234663852886e+38 < local_48.bottom) &&
         (dVar22 = (local_48.bottom - (this->sightstart).Z) / dVar2,
         this->bottomslope <= dVar22 && dVar22 != this->bottomslope)) {
        this->bottomslope = dVar22;
      }
      if ((local_48.top < 3.4028234663852886e+38) &&
         (dVar2 = (local_48.top - (this->sightstart).Z) / dVar2, dVar2 < this->topslope)) {
        this->topslope = dVar2;
      }
      if (local_48.portalflags == 0) {
        iVar13 = -1;
      }
      else {
        local_78.Frac = (this->sightstart).X;
        local_78.topslope = (this->sightstart).Y;
        iVar13 = P_PointOnLineSidePrecise((DVector2 *)&local_78,linedef);
        psVar16 = linedef->backsector;
        if (iVar13 != 0) {
          if (psVar16 == (sector_t_conflict *)0x0) goto LAB_0044da64;
          psVar16 = linedef->frontsector;
          local_48.portalflags =
               ((uint)local_48.portalflags >> 1 & 5) + (local_48.portalflags & 5U) * 2;
        }
        iVar18 = this->portaldir;
        if (iVar18 != 0) {
          if ((local_48.portalflags & 3U) == 2) {
            local_78.Frac = in->frac;
            local_78.topslope = this->topslope;
            local_78.bottomslope = this->bottomslope;
            local_78.direction = 1;
            local_78.portalgroup =
                 (sectorPortals.Array[psVar16->Portals[1]].mDestination)->PortalGroup;
            TArray<SightTask,_SightTask>::Push(&portals,&local_78);
            iVar18 = this->portaldir;
          }
          if (iVar18 == 1) goto LAB_0044da21;
        }
        if ((local_48.portalflags & 0xcU) == 8) {
          local_78.Frac = in->frac;
          local_78.topslope = this->topslope;
          local_78.bottomslope = this->bottomslope;
          local_78.direction = 0;
          local_78.portalgroup =
               (sectorPortals.Array[psVar16->Portals[0]].mDestination)->PortalGroup;
          TArray<SightTask,_SightTask>::Push(&portals,&local_78);
        }
      }
LAB_0044da21:
      if (pFVar20 == (FLinePortal *)0x0) {
        if (local_48.range == 0) {
          return false;
        }
        dVar2 = this->topslope;
        dVar22 = this->bottomslope;
        if (dVar2 <= dVar22) {
          return false;
        }
        if (((linedef->frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count ==
             0) && ((linedef->backsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                    Count == 0)) {
          this->lastsector = (sector_t_conflict *)0x0;
          dVar23 = in->frac;
          dVar24 = (this->sightstart).Z;
        }
        else {
          if (iVar13 == -1) {
            local_78.Frac = (this->sightstart).X;
            local_78.topslope = (this->sightstart).Y;
            iVar13 = P_PointOnLineSidePrecise((DVector2 *)&local_78,linedef);
            dVar2 = this->topslope;
            dVar22 = this->bottomslope;
          }
          ppsVar15 = &linedef->frontsector;
          ppsVar21 = &linedef->backsector;
          dVar23 = in->frac;
          dVar24 = (this->sightstart).Z;
          for (iVar18 = 1; iVar18 != 3; iVar18 = iVar18 + 1) {
            ppsVar14 = ppsVar21;
            if (iVar18 == 1) {
              ppsVar14 = ppsVar15;
            }
            psVar16 = *ppsVar14;
            dVar26 = dVar2 * dVar23;
            dVar27 = dVar23 * dVar22;
            peVar4 = psVar16->e;
            ppFVar19 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
            ppsVar14 = ppsVar21;
            if (iVar18 == 2) {
              ppsVar14 = ppsVar15;
            }
            ppFVar1 = ppFVar19 + (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count
            ;
            dVar28 = dVar22;
            for (; ppFVar19 != ppFVar1; ppFVar19 = ppFVar19 + 1) {
              pFVar5 = *ppFVar19;
              uVar3 = pFVar5->flags;
              if (((uVar3 & 1) != 0 && (uVar3 & 0x2000000) != this->myseethrough) &&
                 (((uVar3 & 2) != 0 || ((this->Flags & 8U) == 0)))) {
                psVar6 = (pFVar5->bottom).plane;
                psVar7 = (pFVar5->top).plane;
                dStack_80 = auVar11._8_8_;
                dVar31 = ((psVar6->normal).Y * dStack_80 + psVar6->D + (psVar6->normal).X * x) *
                         psVar6->negiC;
                dVar30 = ((psVar7->normal).Y * dStack_80 + psVar7->D + (psVar7->normal).X * x) *
                         psVar7->negiC;
                dVar29 = (dVar30 - dVar24) / dVar23;
                dVar32 = (dVar31 - dVar24) / dVar23;
                if (dVar2 <= dVar29) {
                  if (dVar32 <= dVar28) goto LAB_0044da64;
                  if (dVar32 < dVar2) {
                    this->topslope = dVar32;
                    dVar2 = dVar32;
                  }
                }
                else if (dVar32 <= dVar28) {
                  if (dVar28 < dVar29) {
                    this->bottomslope = dVar29;
                    dVar22 = dVar29;
                    dVar28 = dVar29;
                  }
                }
                else {
                  for (lVar17 = 0;
                      (ulong)((*ppsVar14)->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                             Count << 3 != lVar17; lVar17 = lVar17 + 8) {
                    plVar8 = *(long **)((long)((*ppsVar14)->e->XFloor).ffloors.
                                              super_TArray<F3DFloor_*,_F3DFloor_*>.Array + lVar17);
                    if ((*(uint *)(plVar8 + 0xb) & 1) != 0 &&
                        (*(uint *)(plVar8 + 0xb) & 0x2000000) != this->myseethrough) {
                      pdVar9 = (double *)*plVar8;
                      pdVar10 = (double *)plVar8[5];
                      dVar25 = (pdVar9[1] * dStack_80 + pdVar9[3] + *pdVar9 * x) * pdVar9[4];
                      dVar33 = (pdVar10[1] * local_58 + *pdVar10 * x + pdVar10[3]) * pdVar10[4];
                      if (((dVar31 <= dVar25) && (dVar25 <= dVar30)) ||
                         ((dVar33 <= dVar30 && (dVar31 <= dVar33)))) goto LAB_0044da64;
                      if (dVar30 <= dVar33 && dVar25 <= dVar31) {
                        return false;
                      }
                      if (dVar31 <= dVar25 && dVar33 <= dVar30) {
                        return false;
                      }
                    }
                  }
                }
                if (iVar13 == iVar18 + -1 && psVar16 == this->lastsector) {
                  if ((this->Lastztop <= dVar31) && (dVar30 < dVar26 + dVar24)) {
                    this->topslope = dVar32;
                    dVar2 = dVar32;
                  }
                  if ((dVar30 <= this->Lastzbottom) && (dVar27 + dVar24 < dVar30)) {
                    this->bottomslope = dVar29;
                    dVar28 = dVar29;
                    dVar22 = dVar29;
                  }
                }
                if (dVar2 <= dVar28) goto LAB_0044da64;
              }
            }
          }
          if (iVar13 == 0) {
            ppsVar15 = ppsVar21;
          }
          this->lastsector = *ppsVar15;
        }
        this->Lastztop = dVar2 * dVar23 + dVar24;
        this->Lastzbottom = dVar22 * dVar23 + dVar24;
        goto LAB_0044de45;
      }
      local_78.Frac = in->frac;
      local_78.topslope = this->topslope;
      local_78.bottomslope = this->bottomslope;
      local_78.direction = this->portaldir;
      local_78.portalgroup = pFVar20->mDestination->frontsector->PortalGroup;
      TArray<SightTask,_SightTask>::Push(&portals,&local_78);
    }
LAB_0044da64:
    bVar12 = false;
  }
  else {
LAB_0044de45:
    bVar12 = true;
  }
  return bVar12;
}

Assistant:

bool SightCheck::PTR_SightTraverse (intercept_t *in)
{
	line_t  *li;
	double slope;
	SightOpening open;
	int  frontflag = -1;

	li = in->d.line;

//
// crosses a two sided line
//

	// ignore self referencing sectors if COMPAT_TRACE is on
	if ((i_compatflags & COMPATF_TRACE) && li->frontsector == li->backsector) 
		return true;

	double trX = Trace.x + Trace.dx * in->frac;
	double trY = Trace.y + Trace.dy * in->frac;
	P_SightOpening (open, li, trX, trY);

	FLinePortal *lport = li->getPortal();

	if (open.range == 0 && open.portalflags == 0 && (lport == NULL || lport->mType != PORTT_LINKED))		// quick test for totally closed doors (must be delayed if portal checks are needed, though)
		return false;		// stop

	if (in->frac == 0)
		return true;

	// check bottom
	if (open.bottom > LINEOPEN_MIN)
	{
		slope = (open.bottom - sightstart.Z) / in->frac;
		if (slope > bottomslope)
			bottomslope = slope;
	}

	// check top
	if (open.top < LINEOPEN_MAX)
	{
		slope = (open.top - sightstart.Z) / in->frac;
		if (slope < topslope)
			topslope = slope;
	}

	if (open.portalflags)
	{
		sector_t *frontsec, *backsec;
		frontflag = P_PointOnLineSidePrecise(sightstart, li);
		if (!frontflag)
		{
			frontsec = li->frontsector;
			backsec = li->backsector;
		}
		else
		{
			frontsec = li->backsector;
			if (!frontsec) return false;	// We are looking through the backside of a one-sided line. Just abort if that happens.
			backsec = li->frontsector;
			open.SwapSides();				// swap flags to make the next checks simpler.
		}

		if (portaldir != sector_t::floor && (open.portalflags & SO_TOPBACK) && !(open.portalflags & SO_TOPFRONT))
		{
			portals.Push({ in->frac, topslope, bottomslope, sector_t::ceiling, backsec->GetOppositePortalGroup(sector_t::ceiling) });
		}
		if (portaldir != sector_t::ceiling && (open.portalflags & SO_BOTTOMBACK) && !(open.portalflags & SO_BOTTOMFRONT))
		{
			portals.Push({ in->frac, topslope, bottomslope, sector_t::floor, backsec->GetOppositePortalGroup(sector_t::floor) });
		}
	}
	if (lport)
	{
		portals.Push({ in->frac, topslope, bottomslope, portaldir, lport->mDestination->frontsector->PortalGroup });
		return false;
	}

	if (topslope <= bottomslope || open.range == 0)
		return false;		// stop

	// now handle 3D-floors
	if(li->frontsector->e->XFloor.ffloors.Size() || li->backsector->e->XFloor.ffloors.Size())
	{
		if (frontflag == -1) frontflag = P_PointOnLineSidePrecise(sightstart, li);
		
		//Check 3D FLOORS!
		for(int i=1;i<=2;i++)
		{
			sector_t * s=i==1? li->frontsector:li->backsector;
			double    highslope, lowslope;

			double topz= topslope * in->frac + sightstart.Z;
			double bottomz= bottomslope * in->frac + sightstart.Z;

			for (auto rover : s->e->XFloor.ffloors)
			{
				if ((rover->flags & FF_SEETHROUGH) == myseethrough || !(rover->flags & FF_EXISTS)) continue;
				if ((Flags & SF_IGNOREWATERBOUNDARY) && (rover->flags & FF_SOLID) == 0) continue;

				double ff_bottom = rover->bottom.plane->ZatPoint(trX, trY);
				double ff_top = rover->top.plane->ZatPoint(trX, trY);

				highslope = (ff_top - sightstart.Z) / in->frac;
				lowslope = (ff_bottom - sightstart.Z) / in->frac;

				if (highslope >= topslope)
				{
					// blocks completely
					if (lowslope <= bottomslope) return false;
					// blocks upper edge of view
					if (lowslope < topslope) topslope = lowslope;
				}
				else if (lowslope <= bottomslope)
				{
					// blocks lower edge of view
					if (highslope > bottomslope)  bottomslope = highslope;
				}
				else
				{
					// the 3D-floor is inside the viewing cone but neither clips the top nor the bottom so by 
					// itself it can't be view blocking.
					// However, if there's a 3D-floor on the other side that obstructs the same vertical range
					// the 2 together will block sight.
					sector_t * sb = i == 2 ? li->frontsector : li->backsector;

					for (auto rover2 : sb->e->XFloor.ffloors)
					{
						if ((rover2->flags & FF_SEETHROUGH) == myseethrough || !(rover2->flags & FF_EXISTS)) continue;
						if ((Flags & SF_IGNOREWATERBOUNDARY) && (rover->flags & FF_SOLID) == 0) continue;

						double ffb_bottom = rover2->bottom.plane->ZatPoint(trX, trY);
						double ffb_top = rover2->top.plane->ZatPoint(trX, trY);

						if ((ffb_bottom >= ff_bottom && ffb_bottom <= ff_top) ||
							(ffb_top <= ff_top && ffb_top >= ff_bottom) ||
							(ffb_top >= ff_top && ffb_bottom <= ff_bottom) ||
							(ffb_top <= ff_top && ffb_bottom >= ff_bottom))
						{
							return false;
						}
					}
				}
				// trace is leaving a sector with a 3d-floor
				if (s == lastsector && frontflag == i - 1)
				{
					// upper slope intersects with this 3d-floor
					if (Lastztop <= ff_bottom && topz > ff_top)
					{
						topslope = lowslope;
					}
					// lower slope intersects with this 3d-floor
					if (Lastzbottom >= ff_top && bottomz < ff_top)
					{
						bottomslope = highslope;
					}
				}
				if (topslope <= bottomslope) return false;		// stop
			}
		}
		lastsector = frontflag==0 ? li->backsector : li->frontsector;
	}
	else lastsector=NULL;	// don't need it if there are no 3D-floors

	Lastztop = (topslope * in->frac) + sightstart.Z;
	Lastzbottom = (bottomslope * in->frac) + sightstart.Z;

	return true;			// keep going
}